

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void LogRenderedText(ImVec2 *ref_pos,char *text,char *text_end)

{
  int iVar1;
  int iVar2;
  ImGuiWindow *pIVar3;
  ImGuiContext *pIVar4;
  long lVar5;
  uint uVar6;
  char *pcVar7;
  bool bVar8;
  char *pcVar9;
  char *pcVar10;
  
  pIVar4 = GImGui;
  if ((text_end == (char *)0x0) && (text_end = text, text != (char *)0xffffffffffffffff)) {
    do {
      if (*text_end == '#') {
        if (text_end[1] == '#') goto LAB_0015461b;
      }
      else if (*text_end == '\0') goto LAB_0015461b;
      text_end = text_end + 1;
    } while (text_end != (char *)0xffffffffffffffff);
    text_end = (char *)0xffffffffffffffff;
  }
LAB_0015461b:
  pIVar3 = GImGui->CurrentWindow;
  if (ref_pos == (ImVec2 *)0x0) {
    bVar8 = false;
  }
  else {
    bVar8 = (pIVar3->DC).LogLinePosY + 1.0 < ref_pos->y;
    (pIVar3->DC).LogLinePosY = ref_pos->y;
  }
  iVar1 = (pIVar3->DC).TreeDepth;
  if (iVar1 < pIVar4->LogStartDepth) {
    pIVar4->LogStartDepth = iVar1;
  }
  iVar2 = pIVar4->LogStartDepth;
  pcVar10 = text;
  do {
    if (pcVar10 < text_end) {
      lVar5 = (long)text_end - (long)pcVar10;
      pcVar7 = pcVar10;
      do {
        if (*pcVar7 == '\n') goto LAB_001546d4;
        pcVar7 = pcVar7 + 1;
        lVar5 = lVar5 + -1;
      } while (lVar5 != 0);
    }
    pcVar7 = (char *)0x0;
LAB_001546d4:
    pcVar9 = pcVar7;
    if (pcVar7 == (char *)0x0) {
      pcVar9 = text_end;
    }
    if ((pcVar9 != pcVar10 || pcVar7 != (char *)0x0) && pcVar9 != (char *)0x0) {
      uVar6 = (int)pcVar9 - (int)pcVar10;
      if ((bool)(~bVar8 & pcVar10 == text)) {
        ImGui::LogText(" %.*s",(ulong)uVar6,pcVar10);
      }
      else {
        ImGui::LogText("\n%*s%.*s",(ulong)(uint)((iVar1 - iVar2) * 4),"",(ulong)uVar6,pcVar10);
      }
    }
    pcVar10 = pcVar9 + 1;
    if (pcVar7 == (char *)0x0) {
      return;
    }
  } while( true );
}

Assistant:

static void LogRenderedText(const ImVec2* ref_pos, const char* text, const char* text_end = NULL)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    if (!text_end)
        text_end = ImGui::FindRenderedTextEnd(text, text_end);

    const bool log_new_line = ref_pos && (ref_pos->y > window->DC.LogLinePosY + 1);
    if (ref_pos)
        window->DC.LogLinePosY = ref_pos->y;

    const char* text_remaining = text;
    if (g.LogStartDepth > window->DC.TreeDepth)  // Re-adjust padding if we have popped out of our starting depth
        g.LogStartDepth = window->DC.TreeDepth;
    const int tree_depth = (window->DC.TreeDepth - g.LogStartDepth);
    for (;;)
    {
        // Split the string. Each new line (after a '\n') is followed by spacing corresponding to the current depth of our log entry.
        const char* line_end = text_remaining;
        while (line_end < text_end)
            if (*line_end == '\n')
                break;
            else
                line_end++;
        if (line_end >= text_end)
            line_end = NULL;

        const bool is_first_line = (text == text_remaining);
        bool is_last_line = false;
        if (line_end == NULL)
        {
            is_last_line = true;
            line_end = text_end;
        }
        if (line_end != NULL && !(is_last_line && (line_end - text_remaining)==0))
        {
            const int char_count = (int)(line_end - text_remaining);
            if (log_new_line || !is_first_line)
                ImGui::LogText(IM_NEWLINE "%*s%.*s", tree_depth*4, "", char_count, text_remaining);
            else
                ImGui::LogText(" %.*s", char_count, text_remaining);
        }

        if (is_last_line)
            break;
        text_remaining = line_end + 1;
    }
}